

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

void __thiscall Archive::Archive(Archive *this,Buffer *b,bool *error)

{
  ushort uVar1;
  int iVar2;
  long *plVar3;
  bool bVar4;
  string local_a8;
  undefined1 local_88 [8];
  child_iterator it;
  string name;
  anon_class_24_3_713462fb increment;
  Child *c;
  
  this->data = b;
  (this->symbolTable).data = (uint8_t *)0x0;
  (this->symbolTable).len = 0;
  (this->stringTable).data = (uint8_t *)0x0;
  (this->stringTable).len = 0;
  this->firstRegularData = (uint8_t *)0x0;
  *error = false;
  plVar3 = (long *)(b->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  if (((ulong)((long)(b->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)plVar3) < 8) ||
     (*plVar3 != 0xa3e686372613c21)) {
LAB_00c8a828:
    *error = true;
    return;
  }
  child_begin((child_iterator *)local_88,this,false);
  if ((char)it.child.len == '\x01') goto LAB_00c8a828;
  if (it.child.parent == (Archive *)0x0) {
    return;
  }
  increment.error = (bool *)&increment.c;
  name.field_2._8_8_ = (child_iterator *)local_88;
  increment.it = (child_iterator *)error;
  increment.c = (Child **)local_88;
  Child::getRawName_abi_cxx11_((string *)&it.error,(Child *)local_88);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &it.error,"/");
  if (bVar4) {
    uVar1 = *(ushort *)((long)increment.c + 0x14);
    iVar2 = *(int *)(increment.c + 2);
    (this->symbolTable).data = (uint8_t *)((long)&increment.c[1]->parent + (ulong)uVar1);
    (this->symbolTable).len = iVar2 - (uint)uVar1;
    bVar4 = Archive::anon_class_24_3_713462fb::operator()
                      ((anon_class_24_3_713462fb *)((long)&name.field_2 + 8));
    if (bVar4 || it.child.parent == (Archive *)0x0) goto LAB_00c8a938;
    Child::getRawName_abi_cxx11_(&local_a8,(Child *)increment.c);
    std::__cxx11::string::operator=((string *)&it.error,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &it.error,"//");
  if (bVar4) {
    uVar1 = *(ushort *)((long)increment.c + 0x14);
    iVar2 = *(int *)(increment.c + 2);
    (this->stringTable).data = (uint8_t *)((long)&increment.c[1]->parent + (ulong)uVar1);
    (this->stringTable).len = iVar2 - (uint)uVar1;
    bVar4 = Archive::anon_class_24_3_713462fb::operator()
                      ((anon_class_24_3_713462fb *)((long)&name.field_2 + 8));
    if (bVar4 || it.child.parent == (Archive *)0x0) goto LAB_00c8a938;
  }
  else if (*(char *)it._24_8_ == '/') {
    *error = true;
    goto LAB_00c8a938;
  }
  this->firstRegularData = (uint8_t *)increment.c[1];
LAB_00c8a938:
  std::__cxx11::string::~string((string *)&it.error);
  return;
}

Assistant:

Archive::Archive(Buffer& b, bool& error)
  : data(b), symbolTable({nullptr, 0}), stringTable({nullptr, 0}),
    firstRegularData(nullptr) {
  error = false;
  if (data.size() < strlen(magic) ||
      memcmp(data.data(), magic, strlen(magic))) {
    error = true;
    return;
  }

  // We require GNU format archives. So the first member may be named "/" and it
  // points to the symbol table.  The next member may optionally be "//" and
  // point to a string table if a filename is too large to fit in the 16-char
  // name field of the header.
  child_iterator it = child_begin(false);
  if (it.hasError()) {
    error = true;
    return;
  }
  child_iterator end = child_end();
  if (it == end) {
    return; // Empty archive.
  }

  const Child* c = &*it;

  auto increment = [&]() {
    ++it;
    error = it.hasError();
    if (error) {
      return true;
    }
    c = &*it;
    return false;
  };

  std::string name = c->getRawName();
  if (name == "/") {
    symbolTable = c->getBuffer();
    if (increment() || it == end) {
      return;
    }
    name = c->getRawName();
  }

  if (name == "//") {
    stringTable = c->getBuffer();
    if (increment() || it == end) {
      return;
    }
    setFirstRegular(*c);
    return;
  }
  if (name[0] != '/') {
    setFirstRegular(*c);
    return;
  }
  // Not a GNU archive.
  error = true;
}